

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

void cali::util::
     tokenize<std::__cxx11::string,char,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input,
               char *tokens,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               out)

{
  bool bVar1;
  reference pcVar2;
  ulong uVar3;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pbVar4;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88 [3];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  char *local_68;
  char *tc;
  bool is_token_char;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_58;
  char c;
  iterator __end0;
  iterator __begin0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  char *tokens_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_local;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  out_local;
  
  str.field_2._8_8_ = tokens;
  input_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out.container;
  std::__cxx11::string::string((string *)&__range2);
  __end0._M_current = (char *)std::__cxx11::string::begin();
  _Stack_58._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffa8);
    if (!bVar1) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_90 = std::
                   back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&input_local,0);
        pbVar4 = std::
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_90);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(pbVar4,(value_type *)&__range2);
      }
      std::__cxx11::string::~string((string *)&__range2);
      return;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end0);
    tc._7_1_ = *pcVar2;
    tc._6_1_ = '\0';
    for (local_68 = (char *)str.field_2._8_8_; *local_68 != '\0'; local_68 = local_68 + 1) {
      if (tc._7_1_ == *local_68) {
        tc._6_1_ = '\x01';
        break;
      }
    }
    if (tc._6_1_ == '\0') {
      std::__cxx11::string::push_back((char)&__range2);
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_70 = std::
                   back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&input_local,0);
        pbVar4 = std::
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_70);
        std::
        back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(pbVar4,(value_type *)&__range2);
      }
      std::__cxx11::string::clear();
      std::__cxx11::string::push_back((char)&__range2);
      local_88[0] = std::
                    back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&input_local,0);
      pbVar4 = std::
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(local_88);
      std::
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(pbVar4,(value_type *)&__range2);
      std::__cxx11::string::clear();
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void tokenize(String input, const Char* tokens, OutputIterator out)
{
    String str;

    for (Char c : input) {
        bool is_token_char = false;
        for (const Char* tc = tokens; *tc; ++tc)
            if (c == *tc) {
                is_token_char = true;
                break;
            }

        if (is_token_char) {
            if (!str.empty())
                *out++ = str;
            str.clear();

            str.push_back(c);
            *out++ = str;
            str.clear();
        } else {
            str.push_back(c);
        }
    }

    if (!str.empty())
        *out++ = str;
}